

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_info.cpp
# Opt level: O3

void __thiscall license::os::CpuInfo::CpuInfo(CpuInfo *this)

{
  int *piVar1;
  uint *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  uint __max_leaf;
  uint32_t brand [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->_vptr_CpuInfo = (_func_int **)&PTR__CpuInfo_004b0058;
  piVar1 = (int *)cpuid_basic_info(0);
  iVar5 = piVar1[1];
  iVar6 = piVar1[2];
  iVar7 = piVar1[3];
  if (*piVar1 == 0) {
    iVar6 = 0;
    iVar5 = 0;
    iVar7 = 0;
  }
  (this->m_vendor)._M_dataplus._M_p = (pointer)&(this->m_vendor).field_2;
  *(int *)&(this->m_vendor).field_2 = iVar5;
  *(int *)((long)&(this->m_vendor).field_2 + 4) = iVar6;
  *(int *)((long)&(this->m_vendor).field_2 + 8) = iVar7;
  (this->m_vendor)._M_string_length = 0xc;
  (this->m_vendor).field_2._M_local_buf[0xc] = '\0';
  (this->m_brand)._M_dataplus._M_p = (pointer)&(this->m_brand).field_2;
  (this->m_brand)._M_string_length = 0;
  (this->m_brand).field_2._M_local_buf[0] = '\0';
  piVar1 = (int *)cpuid_brand_part3_info(0x80000004);
  if (*piVar1 == 0) {
    std::__cxx11::string::_M_replace((ulong)&this->m_brand,0,(char *)0x0,0x3a52a1);
  }
  else {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    puVar2 = (uint *)cpuid(0x80000000);
    uVar4 = *puVar2;
    if (0x80000001 < uVar4) {
      puVar3 = (undefined8 *)cpuid_brand_part1_info(0x80000002);
      local_98 = *puVar3;
      uStack_90 = CONCAT44(*(undefined4 *)(puVar3 + 1),*(undefined4 *)((long)puVar3 + 0xc));
      if (uVar4 != 0x80000002) {
        puVar3 = (undefined8 *)cpuid_brand_part2_info(0x80000003);
        local_88 = *puVar3;
        uStack_80 = CONCAT44(*(undefined4 *)(puVar3 + 1),*(undefined4 *)((long)puVar3 + 0xc));
        if (0x80000003 < uVar4) {
          uStack_70 = CONCAT44(piVar1[2],piVar1[3]);
          local_78 = *(undefined8 *)piVar1;
        }
      }
    }
    local_50[0] = local_40;
    sVar8 = strlen((char *)&local_98);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,&local_98,(long)&local_98 + sVar8);
    std::__cxx11::string::operator=((string *)&this->m_brand,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return;
}

Assistant:

CpuInfo::CpuInfo() : m_vendor(get_cpu_vendor()), m_brand(get_cpu_brand()) {}